

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O3

Texture1D * __thiscall tcu::Texture1D::operator=(Texture1D *this,Texture1D *other)

{
  ConstPixelBufferAccess *pCVar1;
  
  if (this != other) {
    TextureLevelPyramid::operator=
              (&this->super_TextureLevelPyramid,&other->super_TextureLevelPyramid);
    this->m_width = other->m_width;
    pCVar1 = &((this->super_TextureLevelPyramid).m_access.
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess;
    (this->m_view).m_numLevels =
         (int)((ulong)((long)(this->super_TextureLevelPyramid).m_access.
                             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1) >> 3) *
         -0x33333333;
    (this->m_view).m_levels = pCVar1;
  }
  return this;
}

Assistant:

Texture1D& Texture1D::operator= (const Texture1D& other)
{
	if (this == &other)
		return *this;

	TextureLevelPyramid::operator=(other);

	m_width		= other.m_width;
	m_view		= Texture1DView(getNumLevels(), getLevels());

	return *this;
}